

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectiveParser.cpp
# Opt level: O2

void __thiscall Refal2::CDirectiveParser::wrongDirectiveFormat(CDirectiveParser *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  CParsingElementState::SetWrong
            (&(this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState);
  std::operator+(&local_30,"wrong `",&(this->directive).word);
  std::operator+(&local_50,&local_30,"` directive format");
  CErrorsHelper::RaiseError
            ((CErrorsHelper *)this,ES_Error,&local_50,
             &(this->super_CRuleParser).super_CQualifierParser.token);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CDirectiveParser::wrongDirectiveFormat()
{
	SetWrong();
	CErrorsHelper::RaiseError( ES_Error, "wrong `" + directive.word
		+ "` directive format", token );
}